

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O1

int lws_gate_accepts(lws_context *context,int on)

{
  int iVar1;
  lws_vhost *plVar2;
  
  plVar2 = context->vhost_list;
  _lws_log(4,"%s: on = %d\n","lws_gate_accepts",on);
  if (plVar2 != (lws_vhost *)0x0) {
    do {
      if (((plVar2->tls).use_ssl != 0) && (plVar2->lserv_wsi != (lws *)0x0)) {
        iVar1 = lws_change_pollfd(plVar2->lserv_wsi,(uint)(on == 0),on);
        if (iVar1 != 0) {
          _lws_log(4,"Unable to set accept POLLIN %d\n",on);
        }
      }
      plVar2 = plVar2->vhost_next;
    } while (plVar2 != (lws_vhost *)0x0);
  }
  return 0;
}

Assistant:

int
lws_gate_accepts(struct lws_context *context, int on)
{
	struct lws_vhost *v = context->vhost_list;

	lwsl_notice("%s: on = %d\n", __func__, on);

#if defined(LWS_WITH_STATS)
	context->updated = 1;
#endif

	while (v) {
		if (v->tls.use_ssl && v->lserv_wsi &&
		    lws_change_pollfd(v->lserv_wsi, (LWS_POLLIN) * !on,
				      (LWS_POLLIN) * on))
			lwsl_notice("Unable to set accept POLLIN %d\n", on);

		v = v->vhost_next;
	}

	return 0;
}